

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_mapping_value_epilog
               (fy_emitter *emit,fy_emit_save_ctx *sc,_Bool last,fy_token *fyt_value)

{
  fy_emitter_cfg_flags fVar1;
  int flags;
  int extraout_EDX;
  undefined7 in_register_00000011;
  
  flags = (int)CONCAT71(in_register_00000011,last);
  if ((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x2) == (undefined1  [40])0x0) {
    fVar1 = emit->cfg->flags;
    if (((fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE || (fVar1 & 0xe00000) == FYECF_MODE_JSON) &&
        !last) {
LAB_00128ff6:
      fy_emit_putc(emit,fyewt_indicator,0x2c);
      *(byte *)&emit->flags = (byte)emit->flags & 0xf8;
      flags = extraout_EDX;
    }
    fy_emit_token_comment(emit,fyt_value,flags,sc->indent,fycp_right);
    if (!last) goto LAB_00129080;
  }
  else {
    if (!last) goto LAB_00128ff6;
    fy_emit_token_comment(emit,fyt_value,flags,sc->indent,fycp_right);
  }
  if (((((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x2) != (undefined1  [40])0x0)
       || (fVar1 = emit->cfg->flags,
          (fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE))
      && (fVar1 = emit->cfg->flags & 0xf00000, fVar1 != FYECF_MODE_FLOW_ONELINE)) &&
     ((fVar1 != FYECF_MODE_JSON_ONELINE &&
      ((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x4) == (undefined1  [40])0x0)))
     ) {
    fy_emit_write_indent(emit,sc->old_indent);
  }
LAB_00129080:
  *(byte *)&sc->flags = (byte)sc->flags & 0xfb;
  return;
}

Assistant:

static void fy_emit_mapping_value_epilog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                         bool last, struct fy_token *fyt_value) {
    if ((sc->flow || fy_emit_is_json_mode(emit)) && !last)
        fy_emit_write_indicator(emit, di_comma, sc->flags, sc->indent, fyewt_indicator);

    fy_emit_token_comment(emit, fyt_value, sc->flags, sc->indent, fycp_right);

    if (last && (sc->flow || fy_emit_is_json_mode(emit)) && !fy_emit_is_oneline(emit) && !sc->empty)
        fy_emit_write_indent(emit, sc->old_indent);

    sc->flags &= ~DDNF_MAP;
}